

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int container_at(int x,int y,boolean countem)

{
  obj *poVar1;
  int local_2c;
  int container_count;
  obj *nobj;
  obj *cobj;
  boolean countem_local;
  int y_local;
  int x_local;
  
  local_2c = 0;
  if (level->locations[x][y].typ == '\x1e') {
    if (countem == '\0') {
      return 1;
    }
    local_2c = 1;
  }
  poVar1 = level->objects[x][y];
  do {
    nobj = poVar1;
    if (nobj == (obj *)0x0) {
      return local_2c;
    }
    poVar1 = (nobj->v).v_nexthere;
  } while (((nobj->otyp < 0xda) || (0xe1 < nobj->otyp)) ||
          (local_2c = local_2c + 1, countem != '\0'));
  return local_2c;
}

Assistant:

static int container_at(int x, int y, boolean countem)
{
	struct obj *cobj, *nobj;
	int container_count = 0;

	/*
	 * WARNING: Magic chests are terrain features, not objects, so a
	 * non-zero return value from this function doesn't necessarily mean
	 * there's an object at this location.
	 */
	if (IS_MAGIC_CHEST(level->locations[x][y].typ)) {
		if (countem)
			container_count++;
		else
			return 1;
	}

	for (cobj = level->objects[x][y]; cobj; cobj = nobj) {
		nobj = cobj->nexthere;
		if (Is_container(cobj)) {
			container_count++;
			if (!countem) break;
		}
	}
	return container_count;
}